

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void testing::internal::CaptureStream(int fd,char *stream_name,CapturedStream **stream)

{
  ulong uVar1;
  long *plVar2;
  ostream *poVar3;
  void *pvVar4;
  long *in_RDX;
  CapturedStream *in_RSI;
  int in_stack_0000001c;
  char *in_stack_00000020;
  GTestLogSeverity in_stack_0000002c;
  GTestLog *in_stack_00000030;
  GTestLog local_1c [2];
  
  unique0x1000012a = in_RDX;
  if (*in_RDX != 0) {
    GTestLog::GTestLog(in_stack_00000030,in_stack_0000002c,in_stack_00000020,in_stack_0000001c);
    poVar3 = GTestLog::GetStream(local_1c);
    poVar3 = std::operator<<(poVar3,"Only one ");
    poVar3 = std::operator<<(poVar3,(char *)in_RSI);
    std::operator<<(poVar3," capturer can exist at a time.");
    GTestLog::~GTestLog((GTestLog *)poVar3);
  }
  pvVar4 = operator_new(0x28);
  plVar2 = stack0xffffffffffffffe8;
  uVar1 = (ulong)stack0xffffffffffffffe8 >> 0x20;
  CapturedStream::CapturedStream(in_RSI,(int)uVar1);
  stack0xffffffffffffffe8 = plVar2;
  *stack0xffffffffffffffe8 = (long)pvVar4;
  return;
}

Assistant:

void CaptureStream(int fd, const char* stream_name, CapturedStream** stream) {
  if (*stream != NULL) {
    GTEST_LOG_(FATAL) << "Only one " << stream_name
                      << " capturer can exist at a time.";
  }
  *stream = new CapturedStream(fd);
}